

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cat.cpp
# Opt level: O2

bool __thiscall CmdCat::Execute(CmdCat *this)

{
  string *p;
  char cVar1;
  FileType FVar2;
  ostream *poVar3;
  long *plVar4;
  _List_node_base *p_Var5;
  char *pcVar6;
  char t;
  _List_node_base *local_240;
  ifstream fin;
  
  if ((this->super_Command).option.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size == 0) {
    if ((this->super_Command).parameter.
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl._M_node._M_size != 0) {
      p_Var5 = (_List_node_base *)&(this->super_Command).parameter;
      local_240 = p_Var5;
      while (p_Var5 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var5 != local_240) {
        p = (string *)(p_Var5 + 1);
        FVar2 = DirUtils::GetFileType(p);
        if (FVar2 == DU_DIRECTORY) {
          poVar3 = std::operator<<((ostream *)&std::cout,"cat: ");
          poVar3 = std::operator<<(poVar3,(string *)p);
          poVar3 = std::operator<<(poVar3,": Is a directory");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          std::ifstream::ifstream(&fin,(p->_M_dataplus)._M_p,_S_bin);
          cVar1 = std::__basic_file<char>::is_open();
          if (cVar1 == '\0') {
            poVar3 = std::operator<<((ostream *)&std::cout,"cat: ");
            poVar3 = std::operator<<(poVar3,(string *)p);
            poVar3 = std::operator<<(poVar3,": No such file or directory");
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          else {
            while (plVar4 = (long *)std::istream::read((char *)&fin,(long)&t),
                  (*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
              std::operator<<((ostream *)&std::cout,t);
            }
            std::ifstream::close();
          }
          std::ifstream::~ifstream(&fin);
        }
      }
      return true;
    }
    pcVar6 = "cat: too few arguments given";
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"cat: invalid option -- \'");
    poVar3 = std::operator<<(poVar3,(string *)
                                    ((this->super_Command).option.
                                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl._M_node.super__List_node_base._M_next + 1));
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar6 = "Try \'cat -- help\' for more information.";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool CmdCat::Execute(){
	if(option.size() != 0){	
		cout << "cat: invalid option -- '" << option.front() << "'" << endl;
		cout << "Try 'cat -- help' for more information." << endl;
		return false;
	}
	
	if(parameter.size() == 0){	
		cout << "cat: too few arguments given" << endl;
		return false;
	}

	for(auto i = parameter.begin(); i != parameter.end(); i++){
		if(GetFileType(*i) == DU_DIRECTORY){
			cout << "cat: " << (*i) << ": Is a directory" << endl;
			continue;
		}
		ifstream fin((*i).c_str(), ios::binary);
		if(!fin.is_open()){
			cout << "cat: " << (*i) << ": No such file or directory" << endl;
			continue;
		}
		char t;
		while(fin.read(&t, sizeof(t))){
			cout << t;
		}
		fin.close();
	}

	return true;
}